

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

_Bool pop3_is_multiline(char *cmdline)

{
  int iVar1;
  ulong local_20;
  size_t i;
  char *cmdline_local;
  
  local_20 = 0;
  do {
    if (0x11 < local_20) {
      return true;
    }
    iVar1 = curl_strnequal(pop3cmds[local_20].name,cmdline,(ulong)pop3cmds[local_20].nlen);
    if (iVar1 != 0) {
      if (cmdline[pop3cmds[local_20].nlen] == '\0') {
        return (pop3cmds[local_20].field_0xa & 1) != 0;
      }
      if (cmdline[pop3cmds[local_20].nlen] == ' ') {
        return ((byte)pop3cmds[local_20].field_0xa >> 1 & 1) != 0;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static bool pop3_is_multiline(const char *cmdline)
{
  size_t i;
  for(i = 0; i < ARRAYSIZE(pop3cmds); ++i) {
    if(strncasecompare(pop3cmds[i].name, cmdline, pop3cmds[i].nlen)) {
      if(!cmdline[pop3cmds[i].nlen])
        return pop3cmds[i].multiline;
      else if(cmdline[pop3cmds[i].nlen] == ' ')
        return pop3cmds[i].multiline_with_args;
    }
  }
  /* Unknown command, assume multi-line for backward compatibility with
   * earlier curl versions that only could do multi-line responses. */
  return TRUE;
}